

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O3

int bin_mdef_write_text(bin_mdef_t *m,char *filename)

{
  uint8 uVar1;
  char **ppcVar2;
  mdef_entry_t *pmVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  FILE *__s;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  if (((*filename == '-') && (__s = _stdout, filename[1] == '\0')) ||
     (__s = fopen(filename,"w"), __s != (FILE *)0x0)) {
    fwrite("0.3\n",4,1,__s);
    uVar5 = 0;
    fprintf(__s,"%d n_base\n",(ulong)(uint)m->n_ciphone);
    fprintf(__s,"%d n_tri\n",(ulong)(uint)(m->n_phone - m->n_ciphone));
    uVar6 = m->n_phone;
    if (m->n_emit_state == 0) {
      if (0 < (int)uVar6) {
        lVar9 = 0;
        uVar5 = 0;
        do {
          uVar5 = uVar5 + m->sseq_len[*(int *)((long)&m->phone->ssid + lVar9)] + 1;
          lVar9 = lVar9 + 0xc;
        } while ((ulong)uVar6 * 0xc != lVar9);
      }
    }
    else {
      uVar5 = (m->n_emit_state + 1) * uVar6;
    }
    uVar10 = 0;
    fprintf(__s,"%d n_state_map\n",(ulong)uVar5);
    fprintf(__s,"%d n_tied_state\n",(ulong)(uint)m->n_sen);
    fprintf(__s,"%d n_tied_ci_state\n",(ulong)(uint)m->n_ci_sen);
    fprintf(__s,"%d n_tied_tmat\n",(ulong)(uint)m->n_tmat);
    fwrite("#\n# Columns definitions\n",0x18,1,__s);
    fprintf(__s,"#%4s %3s %3s %1s %6s %4s %s\n","base","lft","rt","p","attrib","tmat",
            "     ... state id\'s ...");
    if (0 < m->n_ciphone) {
      uVar10 = 0;
      do {
        fprintf(__s,"%5s %3s %3s %1s",m->ciname[uVar10],"-","-","-");
        uVar8 = uVar10;
        if ((long)m->n_ciphone <= (long)uVar10) {
          uVar8 = (ulong)m->phone[uVar10].info.ci.reserved[0];
        }
        pcVar7 = "filler";
        if (m->phone[uVar8].info.ci.filler == '\0') {
          pcVar7 = "n/a";
        }
        fprintf(__s," %6s",pcVar7);
        fprintf(__s," %4d",(ulong)(uint)m->phone[uVar10].tmat);
        uVar6 = m->n_emit_state;
        if (uVar6 == 0) {
          uVar6 = (uint)m->sseq_len[m->phone[uVar10].ssid];
        }
        if (0 < (int)uVar6) {
          uVar8 = 0;
          do {
            fprintf(__s," %6u",(ulong)m->sseq[m->phone[uVar10].ssid][uVar8]);
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
        fwrite(" N\n",3,1,__s);
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)m->n_ciphone);
    }
    if ((int)uVar10 < m->n_phone) {
      uVar10 = uVar10 & 0xffffffff;
      do {
        ppcVar2 = m->ciname;
        pmVar3 = m->phone;
        fprintf(__s,"%5s %3s %3s %c",ppcVar2[pmVar3[uVar10].info.ci.reserved[0]],
                ppcVar2[pmVar3[uVar10].info.ci.reserved[1]],
                ppcVar2[pmVar3[uVar10].info.ci.reserved[2]],
                (ulong)(uint)(int)"ibesu"[pmVar3[uVar10].info.ci.filler]);
        pmVar3 = m->phone;
        if ((long)uVar10 < (long)m->n_ciphone) {
          uVar1 = pmVar3[uVar10].info.ci.filler;
        }
        else {
          uVar1 = pmVar3[pmVar3[uVar10].info.ci.reserved[0]].info.ci.filler;
        }
        pcVar7 = "filler";
        if (uVar1 == '\0') {
          pcVar7 = "n/a";
        }
        fprintf(__s," %6s",pcVar7);
        fprintf(__s," %4d",(ulong)(uint)m->phone[uVar10].tmat);
        uVar6 = m->n_emit_state;
        if (uVar6 == 0) {
          uVar6 = (uint)m->sseq_len[m->phone[uVar10].ssid];
        }
        if (0 < (int)uVar6) {
          uVar8 = 0;
          do {
            fprintf(__s," %6u",(ulong)m->sseq[m->phone[uVar10].ssid][uVar8]);
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
        fwrite(" N\n",3,1,__s);
        uVar10 = uVar10 + 1;
      } while ((int)uVar10 < m->n_phone);
    }
    if ((*filename != '-') || (filename[1] != '\0')) {
      fclose(__s);
    }
    iVar4 = 0;
  }
  else {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int
bin_mdef_write_text(bin_mdef_t * m, const char *filename)
{
    FILE *fh;
    int p, i, n_total_state;

    if (strcmp(filename, "-") == 0)
        fh = stdout;
    else {
        if ((fh = fopen(filename, "w")) == NULL)
            return -1;
    }

    fprintf(fh, "0.3\n");
    fprintf(fh, "%d n_base\n", m->n_ciphone);
    fprintf(fh, "%d n_tri\n", m->n_phone - m->n_ciphone);
    if (m->n_emit_state)
        n_total_state = m->n_phone * (m->n_emit_state + 1);
    else {
        n_total_state = 0;
        for (i = 0; i < m->n_phone; ++i)
            n_total_state += m->sseq_len[m->phone[i].ssid] + 1;
    }
    fprintf(fh, "%d n_state_map\n", n_total_state);
    fprintf(fh, "%d n_tied_state\n", m->n_sen);
    fprintf(fh, "%d n_tied_ci_state\n", m->n_ci_sen);
    fprintf(fh, "%d n_tied_tmat\n", m->n_tmat);
    fprintf(fh, "#\n# Columns definitions\n");
    fprintf(fh, "#%4s %3s %3s %1s %6s %4s %s\n",
            "base", "lft", "rt", "p", "attrib", "tmat",
            "     ... state id's ...");

    for (p = 0; p < m->n_ciphone; p++) {
        int n_state;

        fprintf(fh, "%5s %3s %3s %1s", m->ciname[p], "-", "-", "-");

        if (bin_mdef_is_fillerphone(m, p))
            fprintf(fh, " %6s", "filler");
        else
            fprintf(fh, " %6s", "n/a");
        fprintf(fh, " %4d", m->phone[p].tmat);

        if (m->n_emit_state)
            n_state = m->n_emit_state;
        else
            n_state = m->sseq_len[m->phone[p].ssid];
        for (i = 0; i < n_state; i++) {
            fprintf(fh, " %6u", m->sseq[m->phone[p].ssid][i]);
        }
        fprintf(fh, " N\n");
    }


    for (; p < m->n_phone; p++) {
        int n_state;

        fprintf(fh, "%5s %3s %3s %c",
                m->ciname[m->phone[p].info.cd.ctx[0]],
                m->ciname[m->phone[p].info.cd.ctx[1]],
                m->ciname[m->phone[p].info.cd.ctx[2]],
                (WPOS_NAME)[m->phone[p].info.cd.wpos]);

        if (bin_mdef_is_fillerphone(m, p))
            fprintf(fh, " %6s", "filler");
        else
            fprintf(fh, " %6s", "n/a");
        fprintf(fh, " %4d", m->phone[p].tmat);


        if (m->n_emit_state)
            n_state = m->n_emit_state;
        else
            n_state = m->sseq_len[m->phone[p].ssid];
        for (i = 0; i < n_state; i++) {
            fprintf(fh, " %6u", m->sseq[m->phone[p].ssid][i]);
        }
        fprintf(fh, " N\n");
    }

    if (strcmp(filename, "-") != 0)
        fclose(fh);
    return 0;
}